

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpkSets.c
# Opt level: O0

uint Lpk_ComputeSets_rec(Kit_DsdNtk_t *p,int iLit,Vec_Int_t *vSets)

{
  Kit_DsdObj_t KVar1;
  int iVar2;
  uint uVar3;
  Kit_DsdObj_t *pKVar4;
  uint local_90;
  uint s;
  uint Limit;
  uint uSupps [16];
  Kit_DsdObj_t *pObj;
  uint uSuppCur;
  uint uSupport;
  uint iLitFanin;
  uint i;
  Vec_Int_t *vSets_local;
  int iLit_local;
  Kit_DsdNtk_t *p_local;
  
  iVar2 = Abc_Lit2Var(iLit);
  pKVar4 = Kit_DsdNtkObj(p,iVar2);
  if (pKVar4 == (Kit_DsdObj_t *)0x0) {
    iVar2 = Abc_Lit2Var(iLit);
    p_local._4_4_ = 1 << ((byte)iVar2 & 0x1f);
  }
  else if ((((uint)*pKVar4 >> 6 & 7) == 3) || (((uint)*pKVar4 >> 6 & 7) == 4)) {
    pObj._4_4_ = 0;
    for (uSupport = 0; uSupport < (uint)*pKVar4 >> 0x1a; uSupport = uSupport + 1) {
      uVar3 = Lpk_ComputeSets_rec(p,(uint)*(ushort *)(&pKVar4[1].field_0x0 + (ulong)uSupport * 2),
                                  vSets);
      (&s)[uSupport] = uVar3;
      pObj._4_4_ = (&s)[uSupport] | pObj._4_4_;
    }
    KVar1 = *pKVar4;
    for (local_90 = 1; local_90 < (1 << (KVar1._3_1_ >> 2 & 0x1f)) - 1U; local_90 = local_90 + 1) {
      pObj._0_4_ = 0;
      for (uSupport = 0; uSupport < (uint)*pKVar4 >> 0x1a; uSupport = uSupport + 1) {
        if ((local_90 & 1 << ((byte)uSupport & 0x1f)) != 0) {
          pObj._0_4_ = (&s)[uSupport] | (uint)pObj;
        }
      }
      Vec_IntPush(vSets,(uint)pObj);
    }
    p_local._4_4_ = pObj._4_4_;
  }
  else {
    if (((uint)*pKVar4 >> 6 & 7) != 5) {
      __assert_fail("pObj->Type == KIT_DSD_PRIME",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/lpk/lpkSets.c"
                    ,0x55,"unsigned int Lpk_ComputeSets_rec(Kit_DsdNtk_t *, int, Vec_Int_t *)");
    }
    pObj._4_4_ = 0;
    for (uSupport = 0; uSupport < (uint)*pKVar4 >> 0x1a; uSupport = uSupport + 1) {
      uVar3 = Lpk_ComputeSets_rec(p,(uint)*(ushort *)(&pKVar4[1].field_0x0 + (ulong)uSupport * 2),
                                  vSets);
      pObj._4_4_ = uVar3 | pObj._4_4_;
      Vec_IntPush(vSets,uVar3);
    }
    p_local._4_4_ = pObj._4_4_;
  }
  return p_local._4_4_;
}

Assistant:

unsigned Lpk_ComputeSets_rec( Kit_DsdNtk_t * p, int iLit, Vec_Int_t * vSets )
{
    unsigned i, iLitFanin, uSupport, uSuppCur;
    Kit_DsdObj_t * pObj;
    // consider the case of simple gate
    pObj = Kit_DsdNtkObj( p, Abc_Lit2Var(iLit) );
    if ( pObj == NULL )
        return (1 << Abc_Lit2Var(iLit));
    if ( pObj->Type == KIT_DSD_AND || pObj->Type == KIT_DSD_XOR )
    {
        unsigned uSupps[16], Limit, s;
        uSupport = 0;
        Kit_DsdObjForEachFanin( p, pObj, iLitFanin, i )
        {
            uSupps[i] = Lpk_ComputeSets_rec( p, iLitFanin, vSets );
            uSupport |= uSupps[i];
        }
        // create all subsets, except empty and full
        Limit = (1 << pObj->nFans) - 1;
        for ( s = 1; s < Limit; s++ )
        {
            uSuppCur = 0;
            for ( i = 0; i < pObj->nFans; i++ )
                if ( s & (1 << i) )
                    uSuppCur |= uSupps[i];
            Vec_IntPush( vSets, uSuppCur );
        }
        return uSupport;
    }
    assert( pObj->Type == KIT_DSD_PRIME );
    // get the cumulative support of all fanins
    uSupport = 0;
    Kit_DsdObjForEachFanin( p, pObj, iLitFanin, i )
    {
        uSuppCur  = Lpk_ComputeSets_rec( p, iLitFanin, vSets );
        uSupport |= uSuppCur;
        Vec_IntPush( vSets, uSuppCur );
    }
    return uSupport;
}